

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

float __thiscall
TPZMatrix<float>::ConditionNumber(TPZMatrix<float> *this,int p,int64_t numiter,REAL tol)

{
  int iVar1;
  ostream *poVar2;
  float fVar3;
  float invnorm;
  float thisnorm;
  TPZFMatrix<float> Inv;
  REAL localtol;
  int64_t localnumiter;
  DecomposeType in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  TPZMatrix<float> *in_stack_ffffffffffffff28;
  float local_4;
  
  TPZFMatrix<float>::TPZFMatrix
            ((TPZFMatrix<float> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  local_4 = MatrixNorm(this,p,numiter,tol);
  iVar1 = Inverse(in_stack_ffffffffffffff28,
                  (TPZFMatrix<float> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                  ,in_stack_ffffffffffffff1c);
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "TVar TPZMatrix<float>::ConditionNumber(int, int64_t, REAL) [TVar = float]"
                            );
    poVar2 = std::operator<<(poVar2," - it was not possible to compute the inverse matrix.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_4 = 0.0;
  }
  else {
    fVar3 = MatrixNorm(this,p,numiter,tol);
    local_4 = local_4 * fVar3;
  }
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x12fa1e8);
  return local_4;
}

Assistant:

TVar TPZMatrix<TVar>::ConditionNumber(int p, int64_t numiter, REAL tol){
	int64_t localnumiter = numiter;
	REAL localtol = tol;
	TPZFMatrix<TVar> Inv;
	TVar thisnorm = this->MatrixNorm(p, localnumiter, localtol);
	if (!this->Inverse(Inv,ENoDecompose)){
		PZError << __PRETTY_FUNCTION__ << " - it was not possible to compute the inverse matrix." << std:: endl;
		return 0.;
	}
	TVar invnorm = Inv.MatrixNorm(p, numiter, tol);
	return thisnorm * invnorm;
}